

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
dynet::PickRange::autobatch_concat(PickRange *this,ComputationGraph *cg)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  allocator_type *__a;
  value_type_conflict1 *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  uVar1 = 1;
  __a = (allocator_type *)&stack0xffffffffffffffe3;
  std::allocator<int>::allocator((allocator<int> *)0xd14966);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__a);
  std::allocator<int>::~allocator((allocator<int> *)0xd1498b);
  return in_RDI;
}

Assistant:

virtual std::vector<int> autobatch_concat(const ComputationGraph & cg) const override { return std::vector<int>(1, 1); }